

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QLayoutItem * __thiscall QDockWidgetGroupLayout::takeAt(QDockWidgetGroupLayout *this,int index)

{
  QDockAreaLayoutInfo *this_00;
  Data *pDVar1;
  int iVar2;
  QLayoutItem *pQVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long in_FS_OFFSET;
  int x;
  QList<int> local_68;
  QList<int> local_48;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  this_00 = &this->layoutState;
  pQVar3 = QDockAreaLayoutInfo::takeAt(this_00,&local_2c,index);
  if (((this->savedState).rect.x1.m_i <= (this->savedState).rect.x2.m_i) &&
     ((this->savedState).rect.y1.m_i <= (this->savedState).rect.y2.m_i)) {
    iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(pQVar3);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(pQVar3);
      QDockAreaLayoutInfo::indexOf
                (&local_48,&this->savedState,(QWidget *)CONCAT44(extraout_var_00,iVar2));
      if ((undefined1 *)local_48.d.size != (undefined1 *)0x0) {
        QDockAreaLayoutInfo::remove(&this->savedState,(char *)&local_48);
      }
      iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(pQVar3);
      QDockAreaLayoutInfo::indexOf(&local_68,this_00,(QWidget *)CONCAT44(extraout_var_01,iVar2));
      pDVar1 = local_48.d.d;
      local_48.d.size = local_68.d.size;
      local_48.d.ptr = local_68.d.ptr;
      local_48.d.d = local_68.d.d;
      local_68.d.size = 0;
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (int *)0x0;
      if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar1->super_QArrayData,4,0x10);
        }
      }
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
        }
      }
      if (local_48.d.size != 0) {
        QDockAreaLayoutInfo::remove(this_00,(char *)&local_48);
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem* takeAt(int index) override
    {
        int x = 0;
        QLayoutItem *ret = layoutState.takeAt(&x, index);
        if (savedState.rect.isValid() && ret->widget()) {
            // we need to remove the item also from the saved state to prevent crash
            QList<int> path = savedState.indexOf(ret->widget());
            if (!path.isEmpty())
                savedState.remove(path);
            // Also, the item may be contained several times as a gap item.
            path = layoutState.indexOf(ret->widget());
            if (!path.isEmpty())
                layoutState.remove(path);
        }
        return ret;
    }